

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiDockNode * ImGui::DockContextAddNode(ImGuiContext *ctx,ImGuiID id)

{
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *node;
  ImGuiID id_local;
  ImGuiContext *ctx_local;
  
  if (id == 0) {
    node._4_4_ = DockContextGenNodeID(ctx);
  }
  else {
    pIVar1 = DockContextFindNodeByID(ctx,id);
    node._4_4_ = id;
    if (pIVar1 != (ImGuiDockNode *)0x0) {
      __assert_fail("DockContextFindNodeByID(ctx, id) == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x32b3,"ImGuiDockNode *ImGui::DockContextAddNode(ImGuiContext *, ImGuiID)");
    }
  }
  MemAlloc(0xc0);
  pIVar1 = (ImGuiDockNode *)operator_new(0xc0);
  ImGuiDockNode::ImGuiDockNode(pIVar1,node._4_4_);
  ImGuiStorage::SetVoidPtr(&(ctx->DockContext).Nodes,pIVar1->ID,pIVar1);
  return pIVar1;
}

Assistant:

static ImGuiDockNode* ImGui::DockContextAddNode(ImGuiContext* ctx, ImGuiID id)
{
    // Generate an ID for the new node (the exact ID value doesn't matter as long as it is not already used) and add the first window.
    if (id == 0)
        id = DockContextGenNodeID(ctx);
    else
        IM_ASSERT(DockContextFindNodeByID(ctx, id) == NULL);

    // We don't set node->LastFrameAlive on construction. Nodes are always created at all time to reflect .ini settings!
    IMGUI_DEBUG_LOG_DOCKING("DockContextAddNode 0x%08X\n", id);
    ImGuiDockNode* node = IM_NEW(ImGuiDockNode)(id);
    ctx->DockContext.Nodes.SetVoidPtr(node->ID, node);
    return node;
}